

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall
Hpipe::Instruction::apply_rec_rewind_l
          (Instruction *this,function<void_(Hpipe::Instruction_*,_unsigned_int)> *f,
          uint rewind_level)

{
  pointer pTVar1;
  Instruction *pIVar2;
  pointer pTVar3;
  function<void_(Hpipe::Instruction_*,_unsigned_int)> local_50;
  
  if (this->op_id != cur_op_id) {
    this->op_id = cur_op_id;
    std::function<void_(Hpipe::Instruction_*,_unsigned_int)>::operator()(f,this,rewind_level);
    pTVar1 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
             super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pTVar3 = (this->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                  super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
                  super__Vector_impl_data._M_start; pTVar3 != pTVar1; pTVar3 = pTVar3 + 1) {
      pIVar2 = pTVar3->inst;
      std::function<void_(Hpipe::Instruction_*,_unsigned_int)>::function(&local_50,f);
      (*pIVar2->_vptr_Instruction[9])(pIVar2,&local_50,(ulong)rewind_level);
      std::_Function_base::~_Function_base(&local_50.super__Function_base);
    }
  }
  return;
}

Assistant:

void Instruction::apply_rec_rewind_l( std::function<void (Instruction *, unsigned)> f, unsigned rewind_level ) {
    if ( op_id == Instruction::cur_op_id )
        return;
    op_id = Instruction::cur_op_id;

    f( this, rewind_level );

    for( Transition &t : next )
        t.inst->apply_rec_rewind_l( f, rewind_level );
}